

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# steal.c
# Opt level: O2

void mdrop_special_objs(monst *mon)

{
  obj *poVar1;
  boolean bVar2;
  obj *obj;
  
  poVar1 = mon->minvent;
  while (obj = poVar1, obj != (obj *)0x0) {
    poVar1 = obj->nobj;
    bVar2 = obj_resists(obj,0,0);
    if (bVar2 != '\0') {
      obj_extract_self(obj);
      mdrop_obj(mon,obj,'\0');
    }
  }
  return;
}

Assistant:

void mdrop_special_objs(struct monst *mon)
{
    struct obj *obj, *otmp;

    for (obj = mon->minvent; obj; obj = otmp) {
	otmp = obj->nobj;
	/* the Amulet, invocation tools, and Rider corpses resist even when
	   artifacts and ordinary objects are given 0% resistance chance */
	if (obj_resists(obj, 0, 0)) {
	    obj_extract_self(obj);
	    mdrop_obj(mon, obj, FALSE);
	}
    }
}